

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

StructDef *
flatbuffers::anon_unknown_0::LookupTableByName<flatbuffers::StructDef>
          (SymbolTable<flatbuffers::StructDef> *table,string *name,Namespace *current_namespace,
          size_t skip_top)

{
  bool bVar1;
  size_type_conflict sVar2;
  const_reference pvVar3;
  ulong uVar4;
  size_type len;
  StructDef *obj;
  size_t i_1;
  ulong local_68;
  size_t i;
  string full_name;
  unsigned_long N;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *components;
  size_t skip_top_local;
  Namespace *current_namespace_local;
  string *name_local;
  SymbolTable<flatbuffers::StructDef> *table_local;
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
          ::empty(&table->dict);
  if (bVar1) {
    table_local = (SymbolTable<flatbuffers::StructDef> *)0x0;
  }
  else {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&current_namespace->components);
    if (sVar2 < skip_top) {
      table_local = (SymbolTable<flatbuffers::StructDef> *)0x0;
    }
    else {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&current_namespace->components);
      full_name.field_2._8_8_ = sVar2 - skip_top;
      std::__cxx11::string::string((string *)&i);
      for (local_68 = 0; local_68 < (ulong)full_name.field_2._8_8_; local_68 = local_68 + 1) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&current_namespace->components,local_68);
        std::__cxx11::string::operator+=((string *)&i,(string *)pvVar3);
        std::__cxx11::string::operator+=((string *)&i,'.');
      }
      for (obj = (StructDef *)full_name.field_2._8_8_; obj != (StructDef *)0x0;
          obj = (StructDef *)
                ((long)&obj[-1].reserved_ids.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 7)) {
        std::__cxx11::string::operator+=((string *)&i,(string *)name);
        table_local = (SymbolTable<flatbuffers::StructDef> *)
                      SymbolTable<flatbuffers::StructDef>::Lookup(table,(string *)&i);
        if ((StructDef *)table_local != (StructDef *)0x0) goto LAB_0010bca0;
        std::__cxx11::string::size();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&current_namespace->components,
                     (size_type_conflict)
                     ((long)&obj[-1].reserved_ids.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::size();
        std::__cxx11::string::size();
        std::__cxx11::string::resize((ulong)&i);
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        __assert_fail("full_name.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                      ,0xa0,
                      "T *flatbuffers::(anonymous namespace)::LookupTableByName(const SymbolTable<T> &, const std::string &, const Namespace &, size_t) [T = flatbuffers::StructDef]"
                     );
      }
      table_local = (SymbolTable<flatbuffers::StructDef> *)
                    SymbolTable<flatbuffers::StructDef>::Lookup(table,name);
LAB_0010bca0:
      std::__cxx11::string::~string((string *)&i);
    }
  }
  return (StructDef *)table_local;
}

Assistant:

static T *LookupTableByName(const SymbolTable<T> &table,
                            const std::string &name,
                            const Namespace &current_namespace,
                            size_t skip_top) {
  const auto &components = current_namespace.components;
  if (table.dict.empty()) return nullptr;
  if (components.size() < skip_top) return nullptr;
  const auto N = components.size() - skip_top;
  std::string full_name;
  for (size_t i = 0; i < N; i++) {
    full_name += components[i];
    full_name += '.';
  }
  for (size_t i = N; i > 0; i--) {
    full_name += name;
    auto obj = table.Lookup(full_name);
    if (obj) return obj;
    auto len = full_name.size() - components[i - 1].size() - 1 - name.size();
    full_name.resize(len);
  }
  FLATBUFFERS_ASSERT(full_name.empty());
  return table.Lookup(name);  // lookup in global namespace
}